

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostinfo.c
# Opt level: O3

void h2o__hostinfo_getaddr_dispatch_cold_1(void)

{
  FILE *__stream;
  char *pcVar1;
  int in_EDI;
  
  __stream = _stderr;
  pcVar1 = strerror(in_EDI);
  fprintf(__stream,"failed to start first thread for getaddrinfo:%s\n",pcVar1);
  abort();
}

Assistant:

static void create_lookup_thread(void)
{
    pthread_t tid;
    pthread_attr_t attr;
    int ret;

    pthread_attr_init(&attr);
    pthread_attr_setdetachstate(&attr, 1);
    pthread_attr_setstacksize(&attr, 100 * 1024);
    if ((ret = pthread_create(&tid, NULL, lookup_thread_main, NULL)) != 0) {
        if (queue.num_threads == 0) {
            fprintf(stderr, "failed to start first thread for getaddrinfo:%s\n", strerror(ret));
            abort();
        } else {
            perror("pthread_create(for getaddrinfo)");
        }
        return;
    }

    ++queue.num_threads;
    ++queue.num_threads_idle;
}